

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_file_descriptors(archive_write *a)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  archive_write *in_RDI;
  int r;
  int64_t unaff_retaddr;
  int64_t offset;
  int64_t blocks;
  isofile *file;
  iso9660_conflict *iso9660;
  long local_30;
  long local_28;
  long local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  pvVar1 = in_RDI->format_data;
  local_28 = 0;
  local_30 = 0;
  if ((*(long *)((long)pvVar1 + 0x10320) == 0) || (iVar3 = make_boot_catalog(in_RDI), -1 < iVar3)) {
    if (*(long *)((long)pvVar1 + 0x10340) != 0) {
      lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x10340) + 0x18);
      local_28 = (long)*(int *)(lVar2 + 0xa0);
      local_30 = *(long *)(lVar2 + 0x90);
      if (local_30 != 0) {
        iVar3 = write_file_contents((archive_write *)offset,unaff_retaddr,
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (iVar3 < 0) {
          return iVar3;
        }
        local_28 = 0;
        local_30 = 0;
      }
    }
    for (local_20 = *(long *)((long)pvVar1 + 0x98); local_20 != 0;
        local_20 = *(long *)(local_20 + 8)) {
      if (*(int *)(local_20 + 0xb8) != 0) {
        if (local_30 + local_28 * 0x800 < *(long *)(local_20 + 0x90)) {
          if ((0 < local_28) &&
             (iVar3 = write_file_contents((archive_write *)offset,unaff_retaddr,
                                          CONCAT44(in_stack_fffffffffffffffc,
                                                   in_stack_fffffffffffffff8)), iVar3 < 0)) {
            return iVar3;
          }
          local_28 = 0;
          local_30 = *(long *)(local_20 + 0x90);
        }
        *(long *)(local_20 + 0xb0) = local_20 + 0x90;
        do {
          local_28 = *(int *)(*(long *)(local_20 + 0xb0) + 0x10) + local_28;
          *(undefined8 *)(local_20 + 0xb0) = *(undefined8 *)(*(long *)(local_20 + 0xb0) + 0x18);
        } while (*(long *)(local_20 + 0xb0) != 0);
      }
    }
    if ((local_28 < 1) ||
       (iVar3 = write_file_contents((archive_write *)offset,unaff_retaddr,
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)),
       -1 < iVar3)) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int
write_file_descriptors(struct archive_write *a)
{
	struct iso9660 *iso9660 = a->format_data;
	struct isofile *file;
	int64_t blocks, offset;
	int r;

	blocks = 0;
	offset = 0;

	/* Make the boot catalog contents, and write it. */
	if (iso9660->el_torito.catalog != NULL) {
		r = make_boot_catalog(a);
		if (r < 0)
			return (r);
	}

	/* Write the boot file contents. */
	if (iso9660->el_torito.boot != NULL) {
		file = iso9660->el_torito.boot->file;
		blocks = file->content.blocks;
		offset = file->content.offset_of_temp;
		if (offset != 0) {
			r = write_file_contents(a, offset,
			    blocks << LOGICAL_BLOCK_BITS);
			if (r < 0)
				return (r);
			blocks = 0;
			offset = 0;
		}
	}

	/* Write out all file contents. */
	for (file = iso9660->data_file_list.first;
	    file != NULL; file = file->datanext) {

		if (!file->write_content)
			continue;

		if ((offset + (blocks << LOGICAL_BLOCK_BITS)) <
		     file->content.offset_of_temp) {
			if (blocks > 0) {
				r = write_file_contents(a, offset,
				    blocks << LOGICAL_BLOCK_BITS);
				if (r < 0)
					return (r);
			}
			blocks = 0;
			offset = file->content.offset_of_temp;
		}

		file->cur_content = &(file->content);
		do {
			blocks += file->cur_content->blocks;
			/* Next fragument */
			file->cur_content = file->cur_content->next;
		} while (file->cur_content != NULL);
	}

	/* Flush out remaining blocks. */
	if (blocks > 0) {
		r = write_file_contents(a, offset,
		    blocks << LOGICAL_BLOCK_BITS);
		if (r < 0)
			return (r);
	}

	return (ARCHIVE_OK);
}